

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int i;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *unaff_RBX;
  
  pIVar2 = GImGui;
  if ((window != (ImGuiWindow *)0x0) && (behind_window != (ImGuiWindow *)0x0)) {
    pIVar1 = window->RootWindow;
    uVar3 = FindWindowDisplayIndex(unaff_RBX);
    i = FindWindowDisplayIndex(unaff_RBX);
    if ((int)uVar3 < i) {
      ppIVar4 = (pIVar2->Windows).Data;
      memmove(ppIVar4 + (int)uVar3,ppIVar4 + (long)(int)uVar3 + 1,(long)(int)(~uVar3 + i) << 3);
      i = i + -1;
    }
    else {
      ppIVar4 = (pIVar2->Windows).Data;
      memmove(ppIVar4 + (long)i + 1,ppIVar4 + i,(long)(int)(uVar3 - i) << 3);
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,i);
    *ppIVar4 = pIVar1;
    return;
  }
  __assert_fail("window != __null && behind_window != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x1a72,"void ImGui::BringWindowToDisplayBehind(ImGuiWindow *, ImGuiWindow *)");
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}